

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUIScrollBar.cpp
# Opt level: O1

void __thiscall irr::gui::CGUIScrollBar::OnPostRender(CGUIScrollBar *this,u32 timeMs)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  SEvent newEvent;
  
  if ((((this->Dragging == true) && (this->DraggedBySlider == false)) && (this->TrayClick == true))
     && (this->LastChange + 200 < timeMs)) {
    this->LastChange = timeMs;
    iVar1 = this->Pos;
    iVar2 = this->DesiredPos;
    iVar3 = this->LargeStep + iVar1;
    iVar4 = iVar3;
    if (((iVar3 <= iVar2) || (iVar4 = iVar1 - this->LargeStep, iVar2 <= iVar4)) ||
       (iVar4 = iVar2, iVar2 <= iVar3)) {
      (**(code **)(*(long *)this + 0x168))(this,iVar4);
    }
    if ((this->Pos != iVar1) && (*(long **)&this->field_0x20 != (long *)0x0)) {
      (**(code **)(**(long **)&this->field_0x20 + 0x10))();
    }
  }
  return;
}

Assistant:

void CGUIScrollBar::OnPostRender(u32 timeMs)
{
	if (Dragging && !DraggedBySlider && TrayClick && timeMs > LastChange + 200) {
		LastChange = timeMs;

		const s32 oldPos = Pos;

		if (DesiredPos >= Pos + LargeStep)
			setPos(Pos + LargeStep);
		else if (DesiredPos <= Pos - LargeStep)
			setPos(Pos - LargeStep);
		else if (DesiredPos >= Pos - LargeStep && DesiredPos <= Pos + LargeStep)
			setPos(DesiredPos);

		if (Pos != oldPos && Parent) {
			SEvent newEvent;
			newEvent.EventType = EET_GUI_EVENT;
			newEvent.GUIEvent.Caller = this;
			newEvent.GUIEvent.Element = 0;
			newEvent.GUIEvent.EventType = EGET_SCROLL_BAR_CHANGED;
			Parent->OnEvent(newEvent);
		}
	}
}